

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VBufPack_Serial(N_Vector x,void *buf)

{
  int iVar1;
  long lVar2;
  realtype *bd;
  realtype *xd;
  sunindextype N;
  sunindextype i;
  void *buf_local;
  N_Vector x_local;
  int local_4;
  
  if ((x == (N_Vector)0x0) || (buf == (void *)0x0)) {
    local_4 = -1;
  }
  else {
    iVar1 = *x->content;
    lVar2 = *(long *)((long)x->content + 8);
    for (i = 0; i < iVar1; i = i + 1) {
      *(undefined8 *)((long)buf + (long)i * 8) = *(undefined8 *)(lVar2 + (long)i * 8);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int N_VBufPack_Serial(N_Vector x, void *buf)
{
  sunindextype i, N;
  realtype     *xd = NULL;
  realtype     *bd = NULL;

  if (x == NULL || buf == NULL) return(-1);

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  bd = (realtype*) buf;

  for (i = 0; i < N; i++)
    bd[i] = xd[i];

  return(0);
}